

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O1

bool __thiscall
libtorrent::anon_unknown_5::ut_metadata_plugin::received_metadata
          (ut_metadata_plugin *this,ut_metadata_peer_plugin *source,span<const_char> buf,int piece,
          int total_size)

{
  vector<metadata_piece> *this_00;
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined1 extraout_AL;
  int iVar6;
  undefined4 extraout_var;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  time_point tVar7;
  ulong extraout_RAX_02;
  undefined8 *puVar8;
  char *pcVar9;
  pointer pmVar10;
  pointer pmVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar12;
  bt_peer_connection *this_02;
  ulong uVar13;
  time_point tVar14;
  vector<char> *__c;
  bool bVar15;
  span<const_char> metadata_buf;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  vector<char> *local_40;
  char *local_38;
  
  pcVar9 = buf.m_ptr;
  if (0 < (((this->m_torrent->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length) {
    aux::peer_connection::peer_log
              (&source->m_pc->super_peer_connection,info,"UT_METADATA","already have metadata");
    aux::torrent::add_redundant_bytes(this->m_torrent,(int)buf.m_len,piece_unknown);
    return (bool)extraout_AL;
  }
  uVar13 = (ulong)(uint)piece;
  __c = &this->m_metadata;
  if ((this->m_metadata).super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start ==
      (this->m_metadata).super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish) {
    local_38 = pcVar9;
    if (0 < total_size) {
      iVar6 = (*(((this->m_torrent->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_50 = (undefined1  [8])(CONCAT44(extraout_var,iVar6) + 0x438);
      local_48._M_pi = local_48._M_pi & 0xffffffffffffff00;
      local_40 = __c;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
      local_48._M_pi._0_1_ = 1;
      iVar6 = *(int *)(CONCAT44(extraout_var,iVar6) + 0x338);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
      __c = local_40;
      if (total_size <= iVar6) {
        ::std::vector<char,_std::allocator<char>_>::resize
                  (&local_40->super_vector<char,_std::allocator<char>_>,(ulong)(uint)total_size);
        aux::
        container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
        ::resize<int,void>((container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
                            *)&this->m_requested_metadata,total_size + 0x3fffU >> 0xe);
        pcVar9 = local_38;
        goto LAB_003ada34;
      }
    }
    this_02 = source->m_pc;
    pcVar9 = "metadata size too big: %d";
    uVar13 = (ulong)(uint)total_size;
  }
  else {
LAB_003ada34:
    if ((-1 < piece) &&
       (piece < (int)((ulong)((long)(this->m_requested_metadata).
                                    super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                    .
                                    super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_requested_metadata).
                                   super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                   .
                                   super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5))) {
      pcVar2 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (*(int *)&(this->m_metadata).super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (int)pcVar2 != total_size) {
        pcVar3 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        if (pcVar2 == pcVar3) {
          peVar4 = (this->m_torrent->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar4->m_files).m_piece_length < 1) {
            uVar13 = 0;
          }
          else {
            uVar13 = (ulong)(uint)peVar4->m_info_section_size;
          }
        }
        else {
          uVar13 = (ulong)(uint)((int)pcVar3 - (int)pcVar2);
        }
        aux::peer_connection::peer_log
                  (&source->m_pc->super_peer_connection,info,"UT_METADATA",
                   "total_size: %d INCONSISTENT WITH: %d",(ulong)(uint)total_size,uVar13);
        tVar7.__d.__r = (duration)(duration)extraout_RAX_00;
        goto LAB_003adb0c;
      }
      tVar7.__d.__r = (duration)(ulong)(uint)(piece << 0xe);
      pcVar3 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if (pcVar2 == pcVar3) {
        peVar4 = (this->m_torrent->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar4->m_files).m_piece_length < 1) {
          lVar12 = 0;
        }
        else {
          lVar12 = (long)peVar4->m_info_section_size;
        }
      }
      else {
        lVar12 = (long)pcVar3 - (long)pcVar2;
      }
      if (lVar12 < (long)tVar7.__d.__r + buf.m_len) goto LAB_003adb0c;
      this_00 = &this->m_requested_metadata;
      memcpy(pcVar2 + (uint)(piece << 0xe),pcVar9,buf.m_len);
      (this_00->
      super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
      ).
      super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar13].num_requests = 0x7fffffff;
      local_48._M_pi =
           (source->
           super_enable_shared_from_this<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>
           )._M_weak_this.
           super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_48._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_003ade15:
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = if_nametoindex;
        __cxa_throw(puVar8,&::std::bad_weak_ptr::typeinfo,::std::bad_weak_ptr::~bad_weak_ptr);
      }
      iVar6 = (local_48._M_pi)->_M_use_count;
      do {
        if (iVar6 == 0) goto LAB_003ade15;
        LOCK();
        iVar1 = (local_48._M_pi)->_M_use_count;
        bVar15 = iVar6 == iVar1;
        if (bVar15) {
          (local_48._M_pi)->_M_use_count = iVar6 + 1;
          iVar1 = iVar6;
        }
        iVar6 = iVar1;
        UNLOCK();
      } while (!bVar15);
      local_50 = (undefined1  [8])
                 (source->
                 super_enable_shared_from_this<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>
                 )._M_weak_this.
                 super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      pmVar11 = (this_00->
                super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                ).
                super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pmVar11[uVar13].source.
      super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_50;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pmVar11[uVar13].source.
                  super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_48);
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
      pmVar11 = (this->m_requested_metadata).
                super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                .
                super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                ._M_impl.super__Vector_impl_data._M_start;
      tVar7.__d.__r =
           (duration)
           (this->m_requested_metadata).
           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           .
           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      lVar12 = (long)tVar7.__d.__r - (long)pmVar11 >> 7;
      pmVar10 = pmVar11;
      if (0 < lVar12) {
        pmVar10 = (pointer)((long)&pmVar11->num_requests +
                           ((long)tVar7.__d.__r - (long)pmVar11 & 0xffffffffffffff80U));
        lVar12 = lVar12 + 1;
        pmVar11 = pmVar11 + 2;
        do {
          if (pmVar11[-2].num_requests != 0x7fffffff) {
            pmVar11 = pmVar11 + -2;
            goto LAB_003add01;
          }
          if (pmVar11[-1].num_requests != 0x7fffffff) {
            pmVar11 = pmVar11 + -1;
            goto LAB_003add01;
          }
          if (pmVar11->num_requests != 0x7fffffff) goto LAB_003add01;
          if (pmVar11[1].num_requests != 0x7fffffff) {
            pmVar11 = pmVar11 + 1;
            goto LAB_003add01;
          }
          lVar12 = lVar12 + -1;
          pmVar11 = pmVar11 + 4;
        } while (1 < lVar12);
      }
      lVar12 = (long)tVar7.__d.__r - (long)pmVar10 >> 5;
      if (lVar12 == 1) {
LAB_003adcba:
        pmVar11 = pmVar10;
        if (pmVar10->num_requests == 0x7fffffff) {
          pmVar11 = (pointer)tVar7.__d.__r;
        }
      }
      else if (lVar12 == 2) {
LAB_003adcae:
        pmVar11 = pmVar10;
        if (pmVar10->num_requests == 0x7fffffff) {
          pmVar10 = pmVar10 + 1;
          goto LAB_003adcba;
        }
      }
      else {
        pmVar11 = (pointer)tVar7.__d.__r;
        if ((lVar12 == 3) && (pmVar11 = pmVar10, pmVar10->num_requests == 0x7fffffff)) {
          pmVar10 = pmVar10 + 1;
          goto LAB_003adcae;
        }
      }
LAB_003add01:
      if ((duration)pmVar11 == tVar7.__d.__r) {
        pcVar2 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        metadata_buf.m_len =
             (long)(this->m_metadata).super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (long)pcVar2;
        metadata_buf.m_ptr = pcVar2;
        bVar15 = aux::torrent::set_metadata(this->m_torrent,metadata_buf);
        if (bVar15) {
          pcVar2 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          if ((this->m_metadata).super_vector<char,_std::allocator<char>_>.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish != pcVar2) {
            (this->m_metadata).super_vector<char,_std::allocator<char>_>.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish = pcVar2;
          }
          if ((this->m_metadata).super_vector<char,_std::allocator<char>_>.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage !=
              (this->m_metadata).super_vector<char,_std::allocator<char>_>.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish) {
            ::std::__shrink_to_fit_aux<std::vector<char,_std::allocator<char>_>,_true>::_S_do_it
                      (&__c->super_vector<char,_std::allocator<char>_>);
          }
          ::std::
          vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
          ::_M_erase_at_end(&this_00->
                             super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                            ,(this_00->
                             super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                             ).
                             super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          ::std::
          vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
          ::shrink_to_fit(&this_00->
                           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                         );
          tVar7.__d.__r = (duration)(duration)extraout_RAX_01;
        }
        else {
          tVar7.__d.__r =
               (duration)
               (this->m_torrent->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((((element_type *)tVar7.__d.__r)->m_files).m_piece_length < 1) {
            tVar7 = aux::time_now();
            pmVar11 = (this->m_requested_metadata).
                      super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                      .
                      super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pmVar10 = (this->m_requested_metadata).
                      super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                      .
                      super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pmVar11 != pmVar10) {
              tVar14.__d.__r = (duration)(duration)((long)tVar7.__d.__r + 300000000000);
              if ((long)pmVar10 - (long)pmVar11 != 0x20) {
                tVar14 = tVar7;
              }
              do {
                pmVar11->num_requests = 0;
                this_01 = (pmVar11->source).
                          super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  iVar6 = this_01->_M_use_count;
                  do {
                    if (iVar6 == 0) {
                      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      break;
                    }
                    LOCK();
                    iVar1 = this_01->_M_use_count;
                    bVar15 = iVar6 == iVar1;
                    if (bVar15) {
                      this_01->_M_use_count = iVar6 + 1;
                      iVar1 = iVar6;
                    }
                    iVar6 = iVar1;
                    UNLOCK();
                  } while (!bVar15);
                }
                if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  tVar7.__d.__r = (duration)1;
                }
                else {
                  tVar7.__d.__r = (duration)(ulong)(this_01->_M_use_count == 0);
                }
                if ((SUB81(tVar7.__d.__r,0) == '\0') &&
                   (peVar5 = (pmVar11->source).
                             super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr, peVar5 != (element_type *)0x0)) {
                  lVar12 = aux::random((aux *)0x32);
                  tVar7.__d.__r =
                       (duration)((ulong)((int)lVar12 + 0x14) * 1000000000 + (long)tVar14.__d.__r);
                  (peVar5->m_request_limit).__d.__r = (rep)tVar7.__d.__r;
                }
                if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                  tVar7.__d.__r = (duration)(duration)extraout_RAX_02;
                }
                pmVar11 = pmVar11 + 1;
              } while (pmVar11 != pmVar10);
            }
          }
        }
      }
      goto LAB_003adb0c;
    }
    this_02 = source->m_pc;
    pcVar9 = "piece: %d INVALID";
  }
  aux::peer_connection::peer_log(&this_02->super_peer_connection,info,"UT_METADATA",pcVar9,uVar13);
  tVar7.__d.__r = (duration)(duration)extraout_RAX;
LAB_003adb0c:
  return SUB81(tVar7.__d.__r,0);
}

Assistant:

bool ut_metadata_plugin::received_metadata(ut_metadata_peer_plugin& source
		, span<char const> buf, int const piece, int const total_size)
	{
		if (m_torrent.valid_metadata())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "already have metadata");
#endif
			m_torrent.add_redundant_bytes(static_cast<int>(buf.size()), aux::waste_reason::piece_unknown);
			return false;
		}

		if (m_metadata.empty())
		{
			// verify the total_size
			if (total_size <= 0 || total_size > m_torrent.session().settings().get_int(settings_pack::max_metadata_size))
			{
#ifndef TORRENT_DISABLE_LOGGING
				source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
					, "metadata size too big: %d", total_size);
#endif
// #error post alert
				return false;
			}

			m_metadata.resize(total_size);
			m_requested_metadata.resize(div_round_up(total_size, 16 * 1024));
		}

		if (piece < 0 || piece >= m_requested_metadata.end_index())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "piece: %d INVALID", piece);
#endif
			return false;
		}

		if (total_size != m_metadata.end_index())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "total_size: %d INCONSISTENT WITH: %d"
				, total_size, int(metadata().size()));
#endif
			// they disagree about the size!
			return false;
		}

		if (piece * 16 * 1024 + buf.size() > metadata().size())
		{
			// this piece is invalid
			return false;
		}

		std::memcpy(&m_metadata[piece * 16 * 1024], buf.data(), aux::numeric_cast<std::size_t>(buf.size()));
		// mark this piece has 'have'
		m_requested_metadata[piece].num_requests = std::numeric_limits<int>::max();
		m_requested_metadata[piece].source = source.shared_from_this();

		bool have_all = std::all_of(m_requested_metadata.begin(), m_requested_metadata.end()
			, [](metadata_piece const& mp) { return mp.num_requests == std::numeric_limits<int>::max(); });

		if (!have_all) return false;

		if (!m_torrent.set_metadata(m_metadata))
		{
			if (!m_torrent.valid_metadata())
			{
				time_point const now = aux::time_now();
				// any peer that we downloaded metadata from gets a random time
				// penalty, from 5 to 30 seconds or so. During this time we don't
				// make any metadata requests from those peers (to mix it up a bit
				// of which peers we use)
				// if we only have one block, and thus requested it from a single
				// peer, we bump up the retry time a lot more to try other peers
				bool single_peer = m_requested_metadata.size() == 1;
				for (auto& mp : m_requested_metadata)
				{
					mp.num_requests = 0;
					auto peer = mp.source.lock();
					if (!peer) continue;

					peer->failed_hash_check(single_peer ? now + minutes(5) : now);
				}
			}
			return false;
		}

		// free our copy of the metadata and get a reference
		// to the torrent's copy instead. No need to keep two
		// identical copies around
		m_metadata.clear();
		m_metadata.shrink_to_fit();

		// clear the storage for the bitfield
		m_requested_metadata.clear();
		m_requested_metadata.shrink_to_fit();

		return true;
	}